

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_client_request.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::drop_all_pending_commit_elems(raft_server *this)

{
  return_method_type rVar1;
  ulong uVar2;
  unsigned_long uVar3;
  bool bVar4;
  int iVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  size_type sVar9;
  long in_RDI;
  ptr<std::exception> err;
  ptr<buffer> result;
  ptr<commit_ret_elem> *ee_1;
  shared_ptr<nuraft::raft_server::commit_ret_elem> *entry_2;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
  *__range1;
  ptr<commit_ret_elem> *ee;
  pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_> *entry_1;
  iterator __end2_1;
  iterator __begin2_1;
  map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
  *__range2_1;
  lock_guard<std::mutex> guard_1;
  list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
  elems;
  ptr<commit_ret_elem> *elem;
  pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_> *entry;
  iterator __end2;
  iterator __begin2;
  map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
  *__range2;
  ulong max_idx;
  ulong min_idx;
  lock_guard<std::mutex> guard;
  map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
  *in_stack_fffffffffffffe08;
  shared_ptr<nuraft::buffer> *in_stack_fffffffffffffe10;
  value_type *in_stack_fffffffffffffe18;
  cmd_result_code code;
  EventAwaiter *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
  *in_stack_fffffffffffffe30;
  timer_helper *in_stack_fffffffffffffe50;
  shared_ptr<nuraft::buffer> local_178;
  undefined1 local_168 [32];
  string local_148 [32];
  reference local_128;
  reference local_120;
  _Self local_118;
  _Self local_110;
  undefined1 *local_108;
  shared_ptr<nuraft::raft_server::commit_ret_elem> *local_100;
  reference local_f8;
  _Self local_f0;
  _Self local_e8;
  long local_e0;
  undefined1 local_d0 [24];
  string local_b8 [32];
  string local_98 [64];
  shared_ptr<nuraft::raft_server::commit_ret_elem> *local_58;
  reference local_50;
  _Self local_48;
  _Self local_40;
  long local_38;
  ulong local_30;
  unsigned_long local_28;
  
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x258f48);
  nuraft::context::get_params
            ((context *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  peVar6 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x258f65);
  rVar1 = peVar6->return_method_;
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x258f79);
  if (rVar1 == blocking) {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffe10,
               (mutex_type *)in_stack_fffffffffffffe08);
    local_28 = std::numeric_limits<unsigned_long>::max();
    local_30 = 0;
    local_38 = in_RDI + 0x4d8;
    local_40._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
         ::begin(in_stack_fffffffffffffe08);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
         ::end(in_stack_fffffffffffffe08);
    while (bVar4 = std::operator!=(&local_40,&local_48), bVar4) {
      local_50 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
                              *)0x259023);
      local_58 = &local_50->second;
      std::shared_ptr<nuraft::buffer>::shared_ptr
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      std::
      __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x259062);
      std::shared_ptr<nuraft::buffer>::operator=
                (in_stack_fffffffffffffe10,(shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffe08);
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x259080);
      peVar7 = std::
               __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x25908d);
      peVar7->result_code_ = CANCELLED;
      std::
      __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2590a4);
      EventAwaiter::invoke(in_stack_fffffffffffffe20);
      uVar3 = local_28;
      peVar7 = std::
               __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2590cc);
      if (peVar7->idx_ < uVar3) {
        peVar7 = std::
                 __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2590e6);
        local_28 = peVar7->idx_;
      }
      uVar2 = local_30;
      peVar7 = std::
               __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x259126);
      if (uVar2 < peVar7->idx_) {
        peVar7 = std::
                 __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x259140);
        local_30 = peVar7->idx_;
      }
      bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar4) {
        peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x259176);
        iVar5 = (*peVar8->_vptr_logger[7])();
        if (4 < iVar5) {
          peVar8 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2591a6);
          peVar7 = std::
                   __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2591b8);
          uVar2 = peVar7->idx_;
          std::
          __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2591cd);
          in_stack_fffffffffffffe50 =
               (timer_helper *)timer_helper::get_us(in_stack_fffffffffffffe50);
          msg_if_given_abi_cxx11_
                    ((char *)local_98,"cancelled blocking client request %lu, waited %lu us",uVar2,
                     in_stack_fffffffffffffe50);
          (*peVar8->_vptr_logger[8])
                    (peVar8,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                     ,"drop_all_pending_commit_elems",0x119,local_98);
          std::__cxx11::string::~string(local_98);
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
                    *)in_stack_fffffffffffffe10);
    }
    bVar4 = std::
            map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
            ::empty((map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
                     *)0x25928d);
    if ((!bVar4) &&
       (bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318)), bVar4))
    {
      peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2592c0);
      iVar5 = (*peVar8->_vptr_logger[7])();
      if (2 < iVar5) {
        peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2592f0);
        sVar9 = std::
                map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
                ::size((map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
                        *)0x259306);
        msg_if_given_abi_cxx11_
                  ((char *)local_b8,"cancelled %zu blocking client requests from %lu to %lu.",sVar9,
                   local_28,local_30);
        (*peVar8->_vptr_logger[8])
                  (peVar8,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                   ,"drop_all_pending_commit_elems",0x11e,local_b8);
        std::__cxx11::string::~string(local_b8);
      }
    }
    std::
    map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
    ::clear((map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
             *)0x2593a7);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2593b4);
  }
  else {
    std::__cxx11::
    list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
    ::list((list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
            *)0x2593d8);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffe10,
               (mutex_type *)in_stack_fffffffffffffe08);
    local_e0 = in_RDI + 0x4d8;
    local_e8._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
         ::begin(in_stack_fffffffffffffe08);
    local_f0._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
         ::end(in_stack_fffffffffffffe08);
    while (bVar4 = std::operator!=(&local_e8,&local_f0), bVar4) {
      local_f8 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
                              *)0x25945b);
      local_100 = &local_f8->second;
      std::__cxx11::
      list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
      ::push_back((list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
                   *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      std::
      _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
                    *)in_stack_fffffffffffffe10);
    }
    std::
    map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
    ::clear((map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
             *)0x2594ef);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2594fc);
    local_108 = local_d0;
    local_110._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
         ::begin((list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
                  *)in_stack_fffffffffffffe08);
    local_118._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
         ::end((list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
                *)in_stack_fffffffffffffe08);
    while (bVar4 = std::operator!=(&local_110,&local_118), bVar4) {
      local_128 = std::_List_iterator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>::
                  operator*((_List_iterator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>
                             *)0x259561);
      local_120 = local_128;
      bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar4) {
        peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2595a4);
        in_stack_fffffffffffffe2c = (*peVar8->_vptr_logger[7])();
        if (2 < in_stack_fffffffffffffe2c) {
          in_stack_fffffffffffffe20 =
               (EventAwaiter *)
               std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2595d4);
          peVar7 = std::
                   __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2595e6);
          msg_if_given_abi_cxx11_
                    ((char *)local_148,"cancelled non-blocking client request %lu",peVar7->idx_);
          (*(*(_func_int ***)in_stack_fffffffffffffe20)[8])
                    (in_stack_fffffffffffffe20,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                     ,"drop_all_pending_commit_elems",0x133,local_148);
          std::__cxx11::string::~string(local_148);
        }
      }
      std::shared_ptr<nuraft::buffer>::shared_ptr
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      cs_new<std::runtime_error,char_const(&)[19]>((char (*) [19])in_stack_fffffffffffffe08);
      code = (cmd_result_code)((ulong)local_168 >> 0x20);
      in_stack_fffffffffffffe10 = &local_178;
      std::shared_ptr<std::exception>::shared_ptr<std::runtime_error,void>
                ((shared_ptr<std::exception> *)in_stack_fffffffffffffe10,
                 (shared_ptr<std::runtime_error> *)in_stack_fffffffffffffe08);
      std::shared_ptr<std::runtime_error>::~shared_ptr((shared_ptr<std::runtime_error> *)0x2596b7);
      std::
      __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2596c4);
      std::
      __shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2596d3);
      cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::set_result
                (in_stack_fffffffffffffe30,
                 (shared_ptr<nuraft::buffer> *)
                 CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                 (shared_ptr<std::exception> *)in_stack_fffffffffffffe20,code);
      std::shared_ptr<std::exception>::~shared_ptr((shared_ptr<std::exception> *)0x2596fc);
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x259709);
      std::_List_iterator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>::operator++
                (&local_110);
    }
    std::__cxx11::
    list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
    ::~list((list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
             *)0x25976e);
  }
  return;
}

Assistant:

void raft_server::drop_all_pending_commit_elems() {
    // Blocking mode:
    //   Invoke all awaiting requests to return `CANCELLED`.
    if (ctx_->get_params()->return_method_ == raft_params::blocking) {
        auto_lock(commit_ret_elems_lock_);
        ulong min_idx = std::numeric_limits<ulong>::max();
        ulong max_idx = 0;
        for (auto& entry: commit_ret_elems_) {
            ptr<commit_ret_elem>& elem = entry.second;
            elem->ret_value_ = nullptr;
            elem->result_code_ = cmd_result_code::CANCELLED;
            elem->awaiter_.invoke();
            if (min_idx > elem->idx_) {
                min_idx = elem->idx_;
            }
            if (max_idx < elem->idx_) {
                max_idx = elem->idx_;
            }
            p_db("cancelled blocking client request %" PRIu64 ", waited %" PRIu64 " us",
                 elem->idx_, elem->timer_.get_us());
        }
        if (!commit_ret_elems_.empty()) {
            p_wn("cancelled %zu blocking client requests from %" PRIu64
                 " to %" PRIu64 ".",
                 commit_ret_elems_.size(), min_idx, max_idx);
        }
        commit_ret_elems_.clear();
        return;
    }

    // Non-blocking mode:
    //   Set `CANCELLED` and set result & error.
    std::list< ptr<commit_ret_elem> > elems;

    {   auto_lock(commit_ret_elems_lock_);
        for (auto& entry: commit_ret_elems_) {
            ptr<commit_ret_elem>& ee = entry.second;
            elems.push_back(ee);
        }
        commit_ret_elems_.clear();
    }

    // Calling handler should be done outside the mutex.
    for (auto& entry: elems) {
        ptr<commit_ret_elem>&ee = entry;
        p_wn("cancelled non-blocking client request %" PRIu64, ee->idx_);

        ptr<buffer> result = nullptr;
        ptr<std::exception> err =
            cs_new<std::runtime_error>("Request cancelled.");
        ee->async_result_->set_result(result, err, cmd_result_code::CANCELLED);
    }
}